

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Emu.cpp
# Opt level: O2

void __thiscall Ay_Emu::Ay_Emu(Ay_Emu *this)

{
  Ay_Cpu::Ay_Cpu(&this->super_Ay_Cpu);
  Classic_Emu::Classic_Emu(&this->super_Classic_Emu);
  (this->super_Classic_Emu).super_Music_Emu.super_Gme_File._vptr_Gme_File =
       (_func_int **)&PTR__Ay_Emu_0070ade0;
  Ay_Apu::Ay_Apu(&this->apu);
  this->beeper_output = (Blip_Buffer *)0x0;
  (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.type_ = &gme_ay_type_;
  (this->super_Classic_Emu).super_Music_Emu.voice_names_ = Ay_Emu::names;
  (this->super_Classic_Emu).voice_types = Ay_Emu::types;
  (this->super_Classic_Emu).super_Music_Emu.silence_lookahead = 6;
  return;
}

Assistant:

Ay_Emu::Ay_Emu()
{
	beeper_output = 0;
	set_type( gme_ay_type );
	
	static const char* const names [osc_count] = {
		"Wave 1", "Wave 2", "Wave 3", "Beeper"
	};
	set_voice_names( names );
	
	static int const types [osc_count] = {
		wave_type | 0, wave_type | 1, wave_type | 2, mixed_type | 0
	};
	set_voice_types( types );
	set_silence_lookahead( 6 );
}